

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O0

void __thiscall ConnectFourState::do_move(ConnectFourState *this,Move move)

{
  reference pvVar1;
  reference pvVar2;
  int in_ESI;
  int *in_RDI;
  int row;
  int in_stack_00000234;
  char *in_stack_00000238;
  char *in_stack_00000240;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  char cVar3;
  int local_10;
  
  if ((in_ESI < 0) || (in_RDI[2] <= in_ESI)) {
    MCTS::assertion_failed(in_stack_00000240,in_stack_00000238,in_stack_00000234);
  }
  pvVar1 = std::
           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         *)(in_RDI + 4),0);
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)in_ESI);
  if (*pvVar2 != '.') {
    MCTS::assertion_failed(in_stack_00000240,in_stack_00000238,in_stack_00000234);
  }
  check_invariant((ConnectFourState *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0))
  ;
  local_10 = in_RDI[1];
  do {
    local_10 = local_10 + -1;
    pvVar1 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           *)(in_RDI + 4),(long)local_10);
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)in_ESI);
  } while (*pvVar2 != '.');
  cVar3 = ".XO"[*in_RDI];
  pvVar1 = std::
           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         *)(in_RDI + 4),(long)local_10);
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)in_ESI);
  *pvVar2 = cVar3;
  in_RDI[10] = in_ESI;
  in_RDI[0xb] = local_10;
  *in_RDI = 3 - *in_RDI;
  return;
}

Assistant:

void do_move(Move move)
	{
		attest(0 <= move && move < num_cols);
		attest(board[0][move] == player_markers[0]);
		check_invariant();

		int row = num_rows - 1;
		while (board[row][move] != player_markers[0]) row--;
		board[row][move] = player_markers[player_to_move];
		last_col = move;
		last_row = row;

		player_to_move = 3 - player_to_move;
	}